

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O1

void __thiscall Assimp::D3MF::D3MFExporter::writeMesh(D3MFExporter *this,aiMesh *mesh)

{
  ostringstream *poVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  
  if (mesh != (aiMesh *)0x0) {
    poVar1 = &this->mModelOutput;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,XmlTag::mesh_abi_cxx11_,DAT_008d0be8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,XmlTag::vertices_abi_cxx11_,DAT_008d0c08);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (mesh->mNumVertices != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        writeVertex(this,(aiVector3D *)((long)&mesh->mVertices->x + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar4 < mesh->mNumVertices);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,XmlTag::vertices_abi_cxx11_,DAT_008d0c08);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    writeFaces(this,mesh,mesh->mMaterialIndex);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,XmlTag::mesh_abi_cxx11_,DAT_008d0be8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void D3MFExporter::writeMesh( aiMesh *mesh ) {
    if ( nullptr == mesh ) {
        return;
    }

    mModelOutput << "<" << XmlTag::mesh << ">" << std::endl;
    mModelOutput << "<" << XmlTag::vertices << ">" << std::endl;
    for ( unsigned int i = 0; i < mesh->mNumVertices; ++i ) {
        writeVertex( mesh->mVertices[ i ] );
    }
    mModelOutput << "</" << XmlTag::vertices << ">" << std::endl;

    const unsigned int matIdx( mesh->mMaterialIndex );

    writeFaces( mesh, matIdx );

    mModelOutput << "</" << XmlTag::mesh << ">" << std::endl;
}